

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_vtab_config(sqlite3 *db,int op,...)

{
  VtabCtx *pVVar1;
  undefined8 uVar2;
  u8 in_DL;
  int iVar3;
  va_list ap;
  
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  pVVar1 = db->pVtabCtx;
  if (pVVar1 == (VtabCtx *)0x0) {
    uVar2 = 0x2443b;
LAB_00120aeb:
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",uVar2,
                "4635f4a69c8c2a8df242b384a992aea71224e39a2ccab42d8c0b0602f1e826e8");
    iVar3 = 0x15;
    sqlite3Error(db,0x15);
  }
  else {
    if (op == 3) {
      pVVar1->pVTable->eVtabRisk = '\x02';
    }
    else if (op == 2) {
      pVVar1->pVTable->eVtabRisk = '\0';
    }
    else {
      if (op != 1) {
        uVar2 = 0x2444d;
        goto LAB_00120aeb;
      }
      pVVar1->pVTable->bConstraint = in_DL;
    }
    iVar3 = 0;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
  return iVar3;
}

Assistant:

SQLITE_API int sqlite3_vtab_config(sqlite3 *db, int op, ...){
  va_list ap;
  int rc = SQLITE_OK;
  VtabCtx *p;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  p = db->pVtabCtx;
  if( !p ){
    rc = SQLITE_MISUSE_BKPT;
  }else{
    assert( p->pTab==0 || IsVirtual(p->pTab) );
    va_start(ap, op);
    switch( op ){
      case SQLITE_VTAB_CONSTRAINT_SUPPORT: {
        p->pVTable->bConstraint = (u8)va_arg(ap, int);
        break;
      }
      case SQLITE_VTAB_INNOCUOUS: {
        p->pVTable->eVtabRisk = SQLITE_VTABRISK_Low;
        break;
      }
      case SQLITE_VTAB_DIRECTONLY: {
        p->pVTable->eVtabRisk = SQLITE_VTABRISK_High;
        break;
      }
      default: {
        rc = SQLITE_MISUSE_BKPT;
        break;
      }
    }
    va_end(ap);
  }

  if( rc!=SQLITE_OK ) sqlite3Error(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}